

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalInterfaceExamples.cpp
# Opt level: O2

void readGZ2(char *fileName,Array2D<GZ> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  InputFile file;
  FrameBuffer frameBuffer;
  Slice local_68 [56];
  
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(&file,fileName,iVar3);
  Imf_3_2::InputFile::header();
  piVar4 = (int *)Imf_3_2::Header::dataWindow();
  iVar3 = *piVar4;
  iVar1 = piVar4[1];
  iVar2 = piVar4[3];
  *width = (piVar4[2] - iVar3) + 1;
  lVar5 = ((long)iVar2 - (long)iVar1) + 1;
  *height = (int)lVar5;
  Imf_3_2::Array2D<GZ>::resizeErase(pixels,lVar5,(long)*width);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = -(long)iVar1;
  lVar5 = (long)-iVar3;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_2::Slice::Slice
            (local_68,HALF,(char *)(pixels->_data + pixels->_sizeY * lVar6 + lVar5),8,
             (long)*width << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"G");
  Imf_3_2::Slice::Slice
            (local_68,FLOAT,(char *)&pixels->_data[lVar6 * pixels->_sizeY + lVar5].z,8,
             (long)*width << 3,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert((char *)&frameBuffer,(Slice *)"Z");
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&file);
  Imf_3_2::InputFile::readPixels((int)&file,iVar1);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&frameBuffer);
  Imf_3_2::InputFile::~InputFile(&file);
  return;
}

Assistant:

void
readGZ2 (const char fileName[], Array2D<GZ>& pixels, int& width, int& height)
{
    //
    // Read an image using class InputFile.  Try to read one channel,
    // G, of type HALF, and one channel, Z, of type FLOAT.  In memory,
    // the G and Z channels will be interleaved in a single buffer.
    //
    //	- open the file
    //	- allocate memory for the pixels
    //	- describe the layout of the GZ pixel buffer
    //	- read the pixels from the file
    //

    InputFile file (fileName);

    Box2i dw = file.header ().dataWindow ();
    width    = dw.max.x - dw.min.x + 1;
    height   = dw.max.y - dw.min.y + 1;
    int dx   = dw.min.x;
    int dy   = dw.min.y;

    pixels.resizeErase (height, width);

    FrameBuffer frameBuffer;

    frameBuffer.insert (
        "G", // name
        Slice (
            IMF::HALF,                       // type
            (char*) &pixels[-dy][-dx].g,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    frameBuffer.insert (
        "Z", // name
        Slice (
            IMF::FLOAT,                      // type
            (char*) &pixels[-dy][-dx].z,     // base
            sizeof (pixels[0][0]) * 1,       // xStride
            sizeof (pixels[0][0]) * width)); // yStride

    file.setFrameBuffer (frameBuffer);
    file.readPixels (dw.min.y, dw.max.y);
}